

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

fixed_t tmvline1_add(void)

{
  lighttable_t *plVar1;
  fixed_t fVar2;
  DWORD *pDVar3;
  DWORD *pDVar4;
  BYTE *pBVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  long lVar11;
  
  iVar6 = tmvlinebits;
  pBVar5 = dc_source;
  pDVar4 = dc_destblend;
  pDVar3 = dc_srcblend;
  fVar2 = dc_iscale;
  plVar1 = dc_colormap;
  lVar11 = (long)dc_pitch;
  pbVar10 = dc_dest;
  uVar7 = dc_texturefrac;
  iVar9 = dc_count;
  do {
    if ((ulong)pBVar5[uVar7 >> ((byte)iVar6 & 0x3f)] != 0) {
      uVar8 = pDVar4[*pbVar10] + pDVar3[plVar1[pBVar5[uVar7 >> ((byte)iVar6 & 0x3f)]]] | 0x1f07c1f;
      *pbVar10 = RGB32k.All[uVar8 >> 0xf & uVar8];
    }
    uVar7 = uVar7 + fVar2;
    pbVar10 = pbVar10 + lVar11;
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  return uVar7;
}

Assistant:

fixed_t tmvline1_add ()
{
	DWORD fracstep = dc_iscale;
	DWORD frac = dc_texturefrac;
	BYTE *colormap = dc_colormap;
	int count = dc_count;
	const BYTE *source = dc_source;
	BYTE *dest = dc_dest;
	int bits = tmvlinebits;
	int pitch = dc_pitch;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		BYTE pix = source[frac>>bits];
		if (pix != 0)
		{
			DWORD fg = fg2rgb[colormap[pix]];
			DWORD bg = bg2rgb[*dest];
			fg = (fg+bg) | 0x1f07c1f;
			*dest = RGB32k.All[fg & (fg>>15)];
		}
		frac += fracstep;
		dest += pitch;
	} while (--count);

	return frac;
}